

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O1

REF_STATUS ref_clump_short_edges_twod(REF_GRID ref_grid)

{
  double *pdVar1;
  int iVar2;
  int node1;
  REF_NODE ref_node;
  bool bVar3;
  uint uVar4;
  void *pvVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  REF_STATUS RVar10;
  double dVar11;
  REF_EDGE ref_edge;
  REF_DBL edge_ratio;
  char filename [1024];
  REF_EDGE local_448;
  double local_440;
  char local_438 [1032];
  
  ref_node = ref_grid->node;
  uVar4 = ref_edge_create(&local_448,ref_grid);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x1e4,
           "ref_clump_short_edges_twod",(ulong)uVar4,"orig edges");
    return uVar4;
  }
  iVar2 = ref_node->max;
  lVar8 = (long)iVar2;
  if (lVar8 < 0) {
    RVar10 = 1;
    pcVar7 = "malloc ratio of REF_DBL negative";
  }
  else {
    pvVar5 = malloc(lVar8 * 8);
    if (pvVar5 != (void *)0x0) {
      bVar3 = true;
      RVar10 = 0;
      if (iVar2 != 0) {
        dVar11 = ref_grid->adapt->collapse_ratio;
        lVar6 = 0;
        do {
          *(double *)((long)pvVar5 + lVar6 * 8) = dVar11 + dVar11;
          lVar6 = lVar6 + 1;
        } while (lVar8 != lVar6);
      }
      goto LAB_00207864;
    }
    RVar10 = 2;
    pcVar7 = "malloc ratio of REF_DBL NULL";
  }
  bVar3 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x1e7,
         "ref_clump_short_edges_twod",pcVar7);
  pvVar5 = (void *)0x0;
LAB_00207864:
  if (bVar3) {
    if (0 < local_448->n) {
      lVar8 = 0;
      do {
        iVar2 = local_448->e2n[lVar8 * 2];
        node1 = local_448->e2n[lVar8 * 2 + 1];
        uVar4 = ref_node_ratio(ref_node,iVar2,node1,&local_440);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x1ed,"ref_clump_short_edges_twod",(ulong)uVar4,"ratio");
          return uVar4;
        }
        dVar11 = *(double *)((long)pvVar5 + (long)iVar2 * 8);
        if (local_440 <= dVar11) {
          dVar11 = local_440;
        }
        *(double *)((long)pvVar5 + (long)iVar2 * 8) = dVar11;
        dVar11 = *(double *)((long)pvVar5 + (long)node1 * 8);
        if (local_440 <= dVar11) {
          dVar11 = local_440;
        }
        *(double *)((long)pvVar5 + (long)node1 * 8) = dVar11;
        lVar8 = lVar8 + 1;
      } while (lVar8 < local_448->n);
    }
    if (0 < ref_node->max) {
      lVar8 = 0;
      uVar9 = 0;
      do {
        dVar11 = ref_grid->adapt->collapse_ratio;
        pdVar1 = (double *)((long)pvVar5 + lVar8 * 8);
        if (*pdVar1 <= dVar11 && dVar11 != *pdVar1) {
          snprintf(local_438,0x400,"clump%d.t",uVar9);
          uVar4 = ref_clump_tri_around(ref_grid,(REF_INT)lVar8,local_438);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x1f6,"ref_clump_short_edges_twod",(ulong)uVar4,"dump");
            return uVar4;
          }
          uVar9 = (ulong)((int)uVar9 + 1);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < ref_node->max);
    }
    RVar10 = 0;
  }
  return RVar10;
}

Assistant:

REF_FCN REF_STATUS ref_clump_short_edges_twod(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *ratio;
  REF_INT ntarget;
  REF_INT node, node0, node1;
  REF_INT edge;
  REF_DBL edge_ratio;

  char filename[1024];

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc_init(ratio, ref_node_max(ref_node), REF_DBL,
                  2.0 * ref_grid_adapt(ref_grid, collapse_ratio));

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);

    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    ratio[node0] = MIN(ratio[node0], edge_ratio);
    ratio[node1] = MIN(ratio[node1], edge_ratio);
  }

  ntarget = 0;
  for (node = 0; node < ref_node_max(ref_node); node++)
    if (ratio[node] < ref_grid_adapt(ref_grid, collapse_ratio)) {
      snprintf(filename, 1024, "clump%d.t", ntarget);
      RSS(ref_clump_tri_around(ref_grid, node, filename), "dump");
      ntarget++;
    }

  return REF_SUCCESS;
}